

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.hpp
# Opt level: O2

InstanceContext * __thiscall
vkt::SpirVAssembly::createInstanceContext<2ul>
          (InstanceContext *__return_storage_ptr__,SpirVAssembly *this,ShaderElement (*elements) [2]
          ,RGBA (*inputColors) [4],RGBA (*outputColors) [4],
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *testCodeFragments,StageToSpecConstantMap *specConstants,qpTestResult failResult,
          string *failMessageTemplate)

{
  vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
  *this_00;
  long lVar1;
  SpirVAssembly *__b;
  bool bVar2;
  undefined4 in_stack_00000014;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>
  pStack_58;
  
  InstanceContext::InstanceContext
            (__return_storage_ptr__,(RGBA (*) [4])elements,inputColors,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)outputColors,(StageToSpecConstantMap *)testCodeFragments);
  __b = this + 0x40;
  lVar1 = 2;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    this_00 = (vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
                 ::operator[](&__return_storage_ptr__->moduleMap,(key_type *)(__b + -0x40));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits,_true>
              (&pStack_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__b + -0x20),
               (VkShaderStageFlagBits *)__b);
    std::
    vector<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>,std::allocator<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>>
    ::emplace_back<std::pair<std::__cxx11::string,vk::VkShaderStageFlagBits>>(this_00,&pStack_58);
    std::__cxx11::string::~string((string *)&pStack_58);
    __return_storage_ptr__->requiredStages =
         __return_storage_ptr__->requiredStages | *(VkShaderStageFlagBits *)__b;
    __b = __b + 0x48;
  }
  __return_storage_ptr__->failResult = (qpTestResult)specConstants;
  if (*(long *)(CONCAT44(in_stack_00000014,failResult) + 8) != 0) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->failMessageTemplate);
  }
  return __return_storage_ptr__;
}

Assistant:

InstanceContext createInstanceContext (const ShaderElement							(&elements)[N],
									   const tcu::RGBA								(&inputColors)[4],
									   const tcu::RGBA								(&outputColors)[4],
									   const std::map<std::string, std::string>&	testCodeFragments,
									   const StageToSpecConstantMap&				specConstants,
									   const qpTestResult							failResult			= QP_TEST_RESULT_FAIL,
									   const std::string&							failMessageTemplate	= std::string())
{
	InstanceContext ctx (inputColors, outputColors, testCodeFragments, specConstants);
	for (size_t i = 0; i < N; ++i)
	{
		ctx.moduleMap[elements[i].moduleName].push_back(std::make_pair(elements[i].entryName, elements[i].stage));
		ctx.requiredStages = static_cast<vk::VkShaderStageFlagBits>(ctx.requiredStages | elements[i].stage);
	}
	ctx.failResult				= failResult;
	if (!failMessageTemplate.empty())
		ctx.failMessageTemplate	= failMessageTemplate;
	return ctx;
}